

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall Graph::~Graph(Graph *this)

{
  Car *pCVar1;
  pointer pNVar2;
  ostream *poVar3;
  double **ppdVar4;
  long lVar5;
  int i;
  
  this->_vptr_Graph = (_func_int **)&PTR__Graph_00109d88;
  poVar3 = std::operator<<((ostream *)&std::cout,"destructor!");
  std::endl<char,std::char_traits<char>>(poVar3);
  if (this->nodes != (Node *)0x0) {
    operator_delete__(this->nodes);
  }
  this->nodes = (Node *)0x0;
  pCVar1 = this->cars;
  if (pCVar1 != (Car *)0x0) {
    pNVar2 = pCVar1[-1].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (pNVar2 != (pointer)0x0) {
      lVar5 = (long)pNVar2 * 0x30;
      do {
        std::_Vector_base<Node,_std::allocator<Node>_>::~_Vector_base
                  ((_Vector_base<Node,_std::allocator<Node>_> *)((long)pCVar1 + lVar5 + -0x18));
        lVar5 = lVar5 + -0x30;
      } while (lVar5 != 0);
    }
    operator_delete__(&pCVar1[-1].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  }
  this->cars = (Car *)0x0;
  for (lVar5 = 0; ppdVar4 = this->distance_matrix, lVar5 < this->num_node; lVar5 = lVar5 + 1) {
    if (ppdVar4[lVar5] != (double *)0x0) {
      operator_delete__(ppdVar4[lVar5]);
      ppdVar4 = this->distance_matrix;
    }
    ppdVar4[lVar5] = (double *)0x0;
  }
  if (ppdVar4 != (double **)0x0) {
    operator_delete__(ppdVar4);
  }
  this->distance_matrix = (double **)0x0;
  return;
}

Assistant:

Graph::~Graph()
{ 
	std::cout << "destructor!" << std::endl;
	delete[] nodes;
	nodes = nullptr;
	delete[] cars;
	cars = nullptr;
	for(int i = 0; i < num_node; i++){
		delete[] distance_matrix[i];
		distance_matrix[i] = nullptr;
	}
	delete[] distance_matrix;
	distance_matrix = nullptr;
}